

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O1

void olsrv2_tc_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  
  for (plVar3 = _tc_tree.list_head.next; plVar3->prev != _tc_tree.list_head.prev;
      plVar3 = plVar3->next) {
    plVar2 = (plVar3[-5].next)->prev;
    plVar4 = plVar3[-5].next;
    while (plVar2 != plVar3[-5].prev) {
      plVar1 = plVar4->next;
      _remove_edge((olsrv2_tc_edge *)(plVar4 + -3),false);
      plVar4 = plVar1;
      plVar2 = plVar1->prev;
    }
    plVar2 = (plVar3[-3].prev)->prev;
    plVar4 = plVar3[-3].prev;
    while (plVar2 != plVar3[-2].next) {
      plVar1 = plVar4->next;
      olsrv2_tc_endpoint_remove((olsrv2_tc_attachment *)&plVar4[-3].prev);
      plVar4 = plVar1;
      plVar2 = plVar1->prev;
    }
  }
  plVar3 = (_tc_tree.list_head.next)->prev;
  plVar2 = _tc_tree.list_head.next;
  while (plVar3 != _tc_tree.list_head.prev) {
    plVar4 = plVar2->next;
    olsrv2_tc_node_remove((olsrv2_tc_node *)(plVar2 + -0x15));
    plVar2 = plVar4;
    plVar3 = plVar4->prev;
  }
  oonf_class_extension_remove(&_nhdp_neighbor_extension);
  oonf_class_remove(&_tc_endpoint_class);
  oonf_class_remove(&_tc_attached_class);
  oonf_class_remove(&_tc_edge_class);
  oonf_class_remove(&_tc_node_class);
  return;
}

Assistant:

void
olsrv2_tc_cleanup(void) {
  struct olsrv2_tc_node *node, *n_it;
  struct olsrv2_tc_edge *edge, *e_it;
  struct olsrv2_tc_attachment *a_end, *ae_it;

  avl_for_each_element(&_tc_tree, node, _originator_node) {
    avl_for_each_element_safe(&node->_edges, edge, _node, e_it) {
      /* remove edge without cleaning up the node */
      _remove_edge(edge, false);
    }

    avl_for_each_element_safe(&node->_attached_networks, a_end, _src_node, ae_it) {
      olsrv2_tc_endpoint_remove(a_end);
    }
  }

  avl_for_each_element_safe(&_tc_tree, node, _originator_node, n_it) {
    olsrv2_tc_node_remove(node);
  }

  oonf_class_extension_remove(&_nhdp_neighbor_extension);

  oonf_class_remove(&_tc_endpoint_class);
  oonf_class_remove(&_tc_attached_class);
  oonf_class_remove(&_tc_edge_class);
  oonf_class_remove(&_tc_node_class);
}